

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.c
# Opt level: O1

void test_len(void)

{
  uint __line;
  char cVar1;
  int iVar2;
  char *__assertion;
  long lVar3;
  undefined1 local_50 [8];
  queue_t queue;
  qdata_t qdata;
  
  fwrite("test_len() started\n",0x13,1,_stderr);
  cVar1 = queue_init(local_50);
  if (cVar1 == '\0') {
    __assertion = "queue_init(&queue)";
    __line = 0x4a;
  }
  else {
    lVar3 = 0;
    do {
      queue.len = *(uint32_t *)((long)data + lVar3);
      cVar1 = queue_enqueue(local_50,CONCAT44(queue._20_4_,queue.len));
      if (cVar1 == '\0') {
        __assertion = "queue_enqueue(&queue, qdata)";
        __line = 0x4e;
        goto LAB_0010143e;
      }
      lVar3 = lVar3 + 4;
    } while (lVar3 != 4000000);
    iVar2 = queue_len(local_50);
    if (iVar2 == 1000000) {
      lVar3 = 0;
      do {
        cVar1 = queue_dequeue(local_50,&queue.len);
        if (cVar1 == '\0') {
          __assertion = "queue_dequeue(&queue, &qdata)";
          __line = 0x54;
          goto LAB_0010143e;
        }
        if (*(uint32_t *)((long)data + lVar3) != queue.len) {
          __assertion = "data[i] == qdata.i32";
          __line = 0x55;
          goto LAB_0010143e;
        }
        lVar3 = lVar3 + 4;
      } while (lVar3 != 4000000);
      iVar2 = queue_len(local_50);
      if (iVar2 == 0) {
        queue_clear(local_50);
        fwrite("test_len() succeed\n",0x13,1,_stderr);
        return;
      }
      __assertion = "0 == queue_len(&queue)";
      __line = 0x58;
    }
    else {
      __assertion = "LEN == queue_len(&queue)";
      __line = 0x51;
    }
  }
LAB_0010143e:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_queue.c"
                ,__line,"void test_len()");
}

Assistant:

void test_len()
{
    int i;
    qdata_t qdata;
    queue_t queue;

    fprintf(stderr, "test_len() started\n");

    assert(queue_init(&queue));

    for (i = 0; i < LEN; ++i) {
        qdata.i32 = data[i];
        assert(queue_enqueue(&queue, qdata));
    }

    assert(LEN == queue_len(&queue));

    for (i = 0; i < LEN; ++i) {
        assert(queue_dequeue(&queue, &qdata));
        assert(data[i] == qdata.i32);
    }

    assert(0 == queue_len(&queue));

    queue_clear(&queue);

    fprintf(stderr, "test_len() succeed\n");
}